

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspline_patch.h
# Opt level: O3

void __thiscall
embree::BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::
eval<embree::vboolf_impl<4>,embree::vfloat_impl<4>>
          (BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>> *this,vboolf_impl<4> *valid,
          vfloat_impl<4> *uu,vfloat_impl<4> *vv,float *P,float *dPdu,float *dPdv,float *ddPdudu,
          float *ddPdvdv,float *ddPdudv,float dscale,size_t dstride,size_t N)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  
  if ((P != (float *)0x0) && (N != 0)) {
    fVar42 = (uu->field_0).v[0];
    fVar44 = (uu->field_0).v[1];
    fVar46 = (uu->field_0).v[2];
    fVar48 = (uu->field_0).v[3];
    fVar18 = 1.0 - fVar42;
    fVar20 = 1.0 - fVar44;
    fVar22 = 1.0 - fVar46;
    fVar24 = 1.0 - fVar48;
    fVar26 = fVar18 * fVar18 * fVar18;
    fVar28 = fVar20 * fVar20 * fVar20;
    fVar30 = fVar22 * fVar22 * fVar22;
    fVar32 = fVar24 * fVar24 * fVar24;
    fVar34 = fVar42 * fVar42 * fVar42;
    fVar35 = fVar44 * fVar44 * fVar44;
    fVar36 = fVar46 * fVar46 * fVar46;
    fVar37 = fVar48 * fVar48 * fVar48;
    fVar19 = fVar18 * fVar42 * fVar18;
    fVar21 = fVar20 * fVar44 * fVar20;
    fVar23 = fVar22 * fVar46 * fVar22;
    fVar25 = fVar24 * fVar48 * fVar24;
    fVar42 = fVar42 * fVar18 * fVar42;
    fVar44 = fVar44 * fVar20 * fVar44;
    fVar46 = fVar46 * fVar22 * fVar46;
    fVar48 = fVar48 * fVar24 * fVar48;
    fVar18 = (vv->field_0).v[0];
    fVar20 = (vv->field_0).v[1];
    fVar22 = (vv->field_0).v[2];
    fVar24 = (vv->field_0).v[3];
    fVar10 = 1.0 - fVar18;
    fVar12 = 1.0 - fVar20;
    fVar14 = 1.0 - fVar22;
    fVar16 = 1.0 - fVar24;
    fVar38 = fVar10 * fVar10 * fVar10;
    fVar39 = fVar12 * fVar12 * fVar12;
    fVar40 = fVar14 * fVar14 * fVar14;
    fVar41 = fVar16 * fVar16 * fVar16;
    fVar43 = fVar18 * fVar18 * fVar18;
    fVar45 = fVar20 * fVar20 * fVar20;
    fVar47 = fVar22 * fVar22 * fVar22;
    fVar49 = fVar24 * fVar24 * fVar24;
    fVar11 = fVar10 * fVar18 * fVar10;
    fVar13 = fVar12 * fVar20 * fVar12;
    fVar15 = fVar14 * fVar22 * fVar14;
    fVar17 = fVar16 * fVar24 * fVar16;
    fVar18 = fVar18 * fVar10 * fVar18;
    fVar20 = fVar20 * fVar12 * fVar20;
    fVar22 = fVar22 * fVar14 * fVar22;
    fVar24 = fVar24 * fVar16 * fVar24;
    fVar10 = fVar38 * 0.16666667;
    fVar12 = fVar39 * 0.16666667;
    fVar14 = fVar40 * 0.16666667;
    fVar16 = fVar41 * 0.16666667;
    fVar50 = (fVar18 * 6.0 + fVar11 * 12.0 + fVar38 * 4.0 + fVar43) * 0.16666667;
    fVar51 = (fVar20 * 6.0 + fVar13 * 12.0 + fVar39 * 4.0 + fVar45) * 0.16666667;
    fVar52 = (fVar22 * 6.0 + fVar15 * 12.0 + fVar40 * 4.0 + fVar47) * 0.16666667;
    fVar53 = (fVar24 * 6.0 + fVar17 * 12.0 + fVar41 * 4.0 + fVar49) * 0.16666667;
    fVar18 = (fVar11 * 6.0 + fVar18 * 12.0 + fVar43 * 4.0 + fVar38) * 0.16666667;
    fVar20 = (fVar13 * 6.0 + fVar20 * 12.0 + fVar45 * 4.0 + fVar39) * 0.16666667;
    fVar22 = (fVar15 * 6.0 + fVar22 * 12.0 + fVar47 * 4.0 + fVar40) * 0.16666667;
    fVar24 = (fVar17 * 6.0 + fVar24 * 12.0 + fVar49 * 4.0 + fVar41) * 0.16666667;
    fVar43 = fVar43 * 0.16666667;
    fVar45 = fVar45 * 0.16666667;
    fVar47 = fVar47 * 0.16666667;
    fVar49 = fVar49 * 0.16666667;
    sVar9 = 0;
    do {
      fVar11 = *(float *)(this + sVar9 * 4);
      fVar13 = *(float *)(this + sVar9 * 4 + 0x10);
      fVar15 = *(float *)(this + sVar9 * 4 + 0x20);
      fVar17 = *(float *)(this + sVar9 * 4 + 0x30);
      fVar38 = *(float *)(this + sVar9 * 4 + 0x40);
      fVar39 = *(float *)(this + sVar9 * 4 + 0x80);
      fVar40 = *(float *)(this + sVar9 * 4 + 0xc0);
      fVar41 = *(float *)(this + sVar9 * 4 + 0x50);
      fVar27 = *(float *)(this + sVar9 * 4 + 0x90);
      fVar29 = *(float *)(this + sVar9 * 4 + 0xd0);
      fVar31 = *(float *)(this + sVar9 * 4 + 0xa0);
      fVar33 = *(float *)(this + sVar9 * 4 + 0xe0);
      fVar54 = *(float *)(this + sVar9 * 4 + 0x60);
      fVar55 = *(float *)(this + sVar9 * 4 + 0x70);
      fVar56 = *(float *)(this + sVar9 * 4 + 0xb0);
      fVar57 = *(float *)(this + sVar9 * 4 + 0xf0);
      uVar6 = (valid->field_0).i[1];
      uVar7 = (valid->field_0).i[2];
      uVar8 = (valid->field_0).i[3];
      *P = (float)(~(valid->field_0).i[0] & (uint)*P |
                  (uint)((fVar17 * fVar10 + fVar55 * fVar50 + fVar56 * fVar18 + fVar57 * fVar43) *
                         fVar34 * 0.16666667 +
                         (fVar15 * fVar10 + fVar54 * fVar50 + fVar31 * fVar18 + fVar33 * fVar43) *
                         (fVar19 * 6.0 + fVar42 * 12.0 + fVar34 * 4.0 + fVar26) * 0.16666667 +
                         (fVar13 * fVar10 + fVar41 * fVar50 + fVar27 * fVar18 + fVar29 * fVar43) *
                         (fVar42 * 6.0 + fVar19 * 12.0 + fVar26 * 4.0 + fVar34) * 0.16666667 +
                        (fVar11 * fVar10 + fVar38 * fVar50 + fVar39 * fVar18 + fVar40 * fVar43) *
                        fVar26 * 0.16666667) & (valid->field_0).i[0]);
      P[1] = (float)(~uVar6 & (uint)P[1] |
                    (uint)((fVar17 * fVar12 + fVar55 * fVar51 + fVar56 * fVar20 + fVar57 * fVar45) *
                           fVar35 * 0.16666667 +
                           (fVar15 * fVar12 + fVar54 * fVar51 + fVar31 * fVar20 + fVar33 * fVar45) *
                           (fVar21 * 6.0 + fVar44 * 12.0 + fVar35 * 4.0 + fVar28) * 0.16666667 +
                           (fVar13 * fVar12 + fVar41 * fVar51 + fVar27 * fVar20 + fVar29 * fVar45) *
                           (fVar44 * 6.0 + fVar21 * 12.0 + fVar28 * 4.0 + fVar35) * 0.16666667 +
                          (fVar11 * fVar12 + fVar38 * fVar51 + fVar39 * fVar20 + fVar40 * fVar45) *
                          fVar28 * 0.16666667) & uVar6);
      P[2] = (float)(~uVar7 & (uint)P[2] |
                    (uint)((fVar17 * fVar14 + fVar55 * fVar52 + fVar56 * fVar22 + fVar57 * fVar47) *
                           fVar36 * 0.16666667 +
                           (fVar15 * fVar14 + fVar54 * fVar52 + fVar31 * fVar22 + fVar33 * fVar47) *
                           (fVar23 * 6.0 + fVar46 * 12.0 + fVar36 * 4.0 + fVar30) * 0.16666667 +
                           (fVar13 * fVar14 + fVar41 * fVar52 + fVar27 * fVar22 + fVar29 * fVar47) *
                           (fVar46 * 6.0 + fVar23 * 12.0 + fVar30 * 4.0 + fVar36) * 0.16666667 +
                          (fVar11 * fVar14 + fVar38 * fVar52 + fVar39 * fVar22 + fVar40 * fVar47) *
                          fVar30 * 0.16666667) & uVar7);
      P[3] = (float)(~uVar8 & (uint)P[3] |
                    (uint)((fVar17 * fVar16 + fVar55 * fVar53 + fVar56 * fVar24 + fVar57 * fVar49) *
                           fVar37 * 0.16666667 +
                           (fVar15 * fVar16 + fVar54 * fVar53 + fVar31 * fVar24 + fVar33 * fVar49) *
                           (fVar25 * 6.0 + fVar48 * 12.0 + fVar37 * 4.0 + fVar32) * 0.16666667 +
                           (fVar13 * fVar16 + fVar41 * fVar53 + fVar27 * fVar24 + fVar29 * fVar49) *
                           (fVar48 * 6.0 + fVar25 * 12.0 + fVar32 * 4.0 + fVar37) * 0.16666667 +
                          (fVar11 * fVar16 + fVar38 * fVar53 + fVar39 * fVar24 + fVar40 * fVar49) *
                          fVar32 * 0.16666667) & uVar8);
      sVar9 = sVar9 + 1;
      P = P + dstride;
    } while (N != sVar9);
  }
  if (dPdu != (float *)0x0) {
    fVar42 = (uu->field_0).v[0];
    fVar44 = (uu->field_0).v[1];
    fVar46 = (uu->field_0).v[2];
    fVar48 = (uu->field_0).v[3];
    fVar10 = 1.0 - fVar42;
    fVar11 = 1.0 - fVar44;
    fVar12 = 1.0 - fVar46;
    fVar13 = 1.0 - fVar48;
    fVar38 = fVar42 * fVar10;
    fVar39 = fVar44 * fVar11;
    fVar40 = fVar46 * fVar12;
    fVar41 = fVar48 * fVar13;
    fVar19 = fVar10 * fVar10;
    fVar21 = fVar11 * fVar11;
    fVar23 = fVar12 * fVar12;
    fVar25 = fVar13 * fVar13;
    fVar14 = fVar42 * fVar42;
    fVar15 = fVar44 * fVar44;
    fVar16 = fVar46 * fVar46;
    fVar17 = fVar48 * fVar48;
    fVar18 = (vv->field_0).v[0];
    fVar20 = (vv->field_0).v[1];
    fVar22 = (vv->field_0).v[2];
    fVar24 = (vv->field_0).v[3];
    fVar43 = 1.0 - fVar18;
    fVar45 = 1.0 - fVar20;
    fVar47 = 1.0 - fVar22;
    fVar49 = 1.0 - fVar24;
    fVar26 = fVar43 * fVar43;
    fVar28 = fVar45 * fVar45;
    fVar30 = fVar47 * fVar47;
    fVar32 = fVar49 * fVar49;
    fVar34 = fVar18 * fVar18;
    fVar35 = fVar20 * fVar20;
    fVar36 = fVar22 * fVar22;
    fVar37 = fVar24 * fVar24;
    fVar50 = fVar18 * fVar43;
    fVar51 = fVar20 * fVar45;
    fVar52 = fVar22 * fVar47;
    fVar53 = fVar24 * fVar49;
    if (N != 0) {
      fVar26 = fVar26 * fVar43;
      fVar28 = fVar28 * fVar45;
      fVar30 = fVar30 * fVar47;
      fVar32 = fVar32 * fVar49;
      fVar34 = fVar34 * fVar18;
      fVar35 = fVar35 * fVar20;
      fVar36 = fVar36 * fVar22;
      fVar37 = fVar37 * fVar24;
      fVar27 = fVar26 * 0.16666667;
      fVar29 = fVar28 * 0.16666667;
      fVar31 = fVar30 * 0.16666667;
      fVar33 = fVar32 * 0.16666667;
      fVar54 = (fVar18 * fVar50 * 6.0 + fVar43 * fVar50 * 12.0 + fVar26 * 4.0 + fVar34) * 0.16666667
      ;
      fVar55 = (fVar20 * fVar51 * 6.0 + fVar45 * fVar51 * 12.0 + fVar28 * 4.0 + fVar35) * 0.16666667
      ;
      fVar56 = (fVar22 * fVar52 * 6.0 + fVar47 * fVar52 * 12.0 + fVar30 * 4.0 + fVar36) * 0.16666667
      ;
      fVar57 = (fVar24 * fVar53 * 6.0 + fVar49 * fVar53 * 12.0 + fVar32 * 4.0 + fVar37) * 0.16666667
      ;
      fVar18 = (fVar43 * fVar50 * 6.0 + fVar18 * fVar50 * 12.0 + fVar34 * 4.0 + fVar26) * 0.16666667
      ;
      fVar20 = (fVar45 * fVar51 * 6.0 + fVar20 * fVar51 * 12.0 + fVar35 * 4.0 + fVar28) * 0.16666667
      ;
      fVar22 = (fVar47 * fVar52 * 6.0 + fVar22 * fVar52 * 12.0 + fVar36 * 4.0 + fVar30) * 0.16666667
      ;
      fVar24 = (fVar49 * fVar53 * 6.0 + fVar24 * fVar53 * 12.0 + fVar37 * 4.0 + fVar32) * 0.16666667
      ;
      fVar34 = fVar34 * 0.16666667;
      fVar35 = fVar35 * 0.16666667;
      fVar36 = fVar36 * 0.16666667;
      fVar37 = fVar37 * 0.16666667;
      sVar9 = 0;
      do {
        fVar26 = *(float *)(this + sVar9 * 4);
        fVar28 = *(float *)(this + sVar9 * 4 + 0x10);
        fVar30 = *(float *)(this + sVar9 * 4 + 0x20);
        fVar32 = *(float *)(this + sVar9 * 4 + 0x30);
        fVar43 = *(float *)(this + sVar9 * 4 + 0x40);
        fVar45 = *(float *)(this + sVar9 * 4 + 0x80);
        fVar47 = *(float *)(this + sVar9 * 4 + 0xc0);
        fVar49 = *(float *)(this + sVar9 * 4 + 0x50);
        fVar50 = *(float *)(this + sVar9 * 4 + 0x90);
        fVar51 = *(float *)(this + sVar9 * 4 + 0xd0);
        fVar52 = *(float *)(this + sVar9 * 4 + 0xa0);
        fVar53 = *(float *)(this + sVar9 * 4 + 0xe0);
        fVar1 = *(float *)(this + sVar9 * 4 + 0x60);
        fVar2 = *(float *)(this + sVar9 * 4 + 0x70);
        fVar3 = *(float *)(this + sVar9 * 4 + 0xb0);
        fVar4 = *(float *)(this + sVar9 * 4 + 0xf0);
        uVar6 = (valid->field_0).i[1];
        uVar7 = (valid->field_0).i[2];
        uVar8 = (valid->field_0).i[3];
        *dPdu = (float)(~(valid->field_0).i[0] & (uint)*dPdu |
                       (uint)(((fVar32 * fVar27 + fVar2 * fVar54 + fVar3 * fVar18 + fVar4 * fVar34)
                               * fVar14 * 0.5 +
                               (fVar30 * fVar27 + fVar1 * fVar54 + fVar52 * fVar18 + fVar53 * fVar34
                               ) * (fVar19 + fVar38 * 4.0) * 0.5 +
                               (fVar28 * fVar27 +
                               fVar49 * fVar54 + fVar50 * fVar18 + fVar51 * fVar34) *
                               (-fVar42 * fVar42 - fVar38 * 4.0) * 0.5 +
                              (fVar26 * fVar27 + fVar43 * fVar54 + fVar45 * fVar18 + fVar47 * fVar34
                              ) * -fVar10 * fVar10 * 0.5) * dscale) & (valid->field_0).i[0]);
        dPdu[1] = (float)(~uVar6 & (uint)dPdu[1] |
                         (uint)(((fVar32 * fVar29 + fVar2 * fVar55 + fVar3 * fVar20 + fVar4 * fVar35
                                 ) * fVar15 * 0.5 +
                                 (fVar30 * fVar29 +
                                 fVar1 * fVar55 + fVar52 * fVar20 + fVar53 * fVar35) *
                                 (fVar21 + fVar39 * 4.0) * 0.5 +
                                 (fVar28 * fVar29 +
                                 fVar49 * fVar55 + fVar50 * fVar20 + fVar51 * fVar35) *
                                 (-fVar44 * fVar44 - fVar39 * 4.0) * 0.5 +
                                (fVar26 * fVar29 +
                                fVar43 * fVar55 + fVar45 * fVar20 + fVar47 * fVar35) *
                                -fVar11 * fVar11 * 0.5) * dscale) & uVar6);
        dPdu[2] = (float)(~uVar7 & (uint)dPdu[2] |
                         (uint)(((fVar32 * fVar31 + fVar2 * fVar56 + fVar3 * fVar22 + fVar4 * fVar36
                                 ) * fVar16 * 0.5 +
                                 (fVar30 * fVar31 +
                                 fVar1 * fVar56 + fVar52 * fVar22 + fVar53 * fVar36) *
                                 (fVar23 + fVar40 * 4.0) * 0.5 +
                                 (fVar28 * fVar31 +
                                 fVar49 * fVar56 + fVar50 * fVar22 + fVar51 * fVar36) *
                                 (-fVar46 * fVar46 - fVar40 * 4.0) * 0.5 +
                                (fVar26 * fVar31 +
                                fVar43 * fVar56 + fVar45 * fVar22 + fVar47 * fVar36) *
                                -fVar12 * fVar12 * 0.5) * dscale) & uVar7);
        dPdu[3] = (float)(~uVar8 & (uint)dPdu[3] |
                         (uint)(((fVar32 * fVar33 + fVar2 * fVar57 + fVar3 * fVar24 + fVar4 * fVar37
                                 ) * fVar17 * 0.5 +
                                 (fVar30 * fVar33 +
                                 fVar1 * fVar57 + fVar52 * fVar24 + fVar53 * fVar37) *
                                 (fVar25 + fVar41 * 4.0) * 0.5 +
                                 (fVar28 * fVar33 +
                                 fVar49 * fVar57 + fVar50 * fVar24 + fVar51 * fVar37) *
                                 (-fVar48 * fVar48 - fVar41 * 4.0) * 0.5 +
                                (fVar26 * fVar33 +
                                fVar43 * fVar57 + fVar45 * fVar24 + fVar47 * fVar37) *
                                -fVar13 * fVar13 * 0.5) * dscale) & uVar8);
        sVar9 = sVar9 + 1;
        dPdu = dPdu + dstride;
      } while (N != sVar9);
      fVar42 = (uu->field_0).v[0];
      fVar44 = (uu->field_0).v[1];
      fVar46 = (uu->field_0).v[2];
      fVar48 = (uu->field_0).v[3];
      fVar18 = (vv->field_0).v[0];
      fVar20 = (vv->field_0).v[1];
      fVar22 = (vv->field_0).v[2];
      fVar24 = (vv->field_0).v[3];
      fVar10 = 1.0 - fVar42;
      fVar11 = 1.0 - fVar44;
      fVar12 = 1.0 - fVar46;
      fVar13 = 1.0 - fVar48;
      fVar19 = fVar10 * fVar10;
      fVar21 = fVar11 * fVar11;
      fVar23 = fVar12 * fVar12;
      fVar25 = fVar13 * fVar13;
      fVar14 = fVar42 * fVar42;
      fVar15 = fVar44 * fVar44;
      fVar16 = fVar46 * fVar46;
      fVar17 = fVar48 * fVar48;
      fVar38 = fVar42 * fVar10;
      fVar39 = fVar44 * fVar11;
      fVar40 = fVar46 * fVar12;
      fVar41 = fVar48 * fVar13;
      fVar43 = 1.0 - fVar18;
      fVar45 = 1.0 - fVar20;
      fVar47 = 1.0 - fVar22;
      fVar49 = 1.0 - fVar24;
      fVar50 = fVar18 * fVar43;
      fVar51 = fVar20 * fVar45;
      fVar52 = fVar22 * fVar47;
      fVar53 = fVar24 * fVar49;
      fVar26 = fVar43 * fVar43;
      fVar28 = fVar45 * fVar45;
      fVar30 = fVar47 * fVar47;
      fVar32 = fVar49 * fVar49;
      fVar34 = fVar18 * fVar18;
      fVar35 = fVar20 * fVar20;
      fVar36 = fVar22 * fVar22;
      fVar37 = fVar24 * fVar24;
    }
    if (N != 0) {
      fVar19 = fVar19 * fVar10;
      fVar21 = fVar21 * fVar11;
      fVar23 = fVar23 * fVar12;
      fVar25 = fVar25 * fVar13;
      fVar14 = fVar14 * fVar42;
      fVar15 = fVar15 * fVar44;
      fVar16 = fVar16 * fVar46;
      fVar17 = fVar17 * fVar48;
      fVar43 = -fVar43 * fVar43 * 0.5;
      fVar45 = -fVar45 * fVar45 * 0.5;
      fVar47 = -fVar47 * fVar47 * 0.5;
      fVar49 = -fVar49 * fVar49 * 0.5;
      fVar27 = (-fVar18 * fVar18 - fVar50 * 4.0) * 0.5;
      fVar29 = (-fVar20 * fVar20 - fVar51 * 4.0) * 0.5;
      fVar31 = (-fVar22 * fVar22 - fVar52 * 4.0) * 0.5;
      fVar33 = (-fVar24 * fVar24 - fVar53 * 4.0) * 0.5;
      fVar18 = (fVar26 + fVar50 * 4.0) * 0.5;
      fVar20 = (fVar28 + fVar51 * 4.0) * 0.5;
      fVar22 = (fVar30 + fVar52 * 4.0) * 0.5;
      fVar24 = (fVar32 + fVar53 * 4.0) * 0.5;
      fVar34 = fVar34 * 0.5;
      fVar35 = fVar35 * 0.5;
      fVar36 = fVar36 * 0.5;
      fVar37 = fVar37 * 0.5;
      sVar9 = 0;
      do {
        fVar26 = *(float *)(this + sVar9 * 4);
        fVar28 = *(float *)(this + sVar9 * 4 + 0x10);
        fVar30 = *(float *)(this + sVar9 * 4 + 0x20);
        fVar32 = *(float *)(this + sVar9 * 4 + 0x30);
        fVar50 = *(float *)(this + sVar9 * 4 + 0x40);
        fVar51 = *(float *)(this + sVar9 * 4 + 0x80);
        fVar52 = *(float *)(this + sVar9 * 4 + 0xc0);
        fVar53 = *(float *)(this + sVar9 * 4 + 0x50);
        fVar54 = *(float *)(this + sVar9 * 4 + 0x90);
        fVar55 = *(float *)(this + sVar9 * 4 + 0xd0);
        fVar56 = *(float *)(this + sVar9 * 4 + 0xa0);
        fVar57 = *(float *)(this + sVar9 * 4 + 0xe0);
        fVar1 = *(float *)(this + sVar9 * 4 + 0x60);
        fVar2 = *(float *)(this + sVar9 * 4 + 0x70);
        fVar3 = *(float *)(this + sVar9 * 4 + 0xb0);
        fVar4 = *(float *)(this + sVar9 * 4 + 0xf0);
        uVar6 = (valid->field_0).i[1];
        uVar7 = (valid->field_0).i[2];
        uVar8 = (valid->field_0).i[3];
        *dPdv = (float)(~(valid->field_0).i[0] & (uint)*dPdv |
                       (uint)(((fVar32 * fVar43 + fVar2 * fVar27 + fVar3 * fVar18 + fVar4 * fVar34)
                               * fVar14 * 0.16666667 +
                               (fVar30 * fVar43 + fVar1 * fVar27 + fVar56 * fVar18 + fVar57 * fVar34
                               ) * (fVar10 * fVar38 * 6.0 + fVar42 * fVar38 * 12.0 +
                                   fVar14 * 4.0 + fVar19) * 0.16666667 +
                               (fVar28 * fVar43 +
                               fVar53 * fVar27 + fVar54 * fVar18 + fVar55 * fVar34) *
                               (fVar42 * fVar38 * 6.0 + fVar10 * fVar38 * 12.0 +
                               fVar19 * 4.0 + fVar14) * 0.16666667 +
                              (fVar26 * fVar43 + fVar50 * fVar27 + fVar51 * fVar18 + fVar52 * fVar34
                              ) * fVar19 * 0.16666667) * dscale) & (valid->field_0).i[0]);
        dPdv[1] = (float)(~uVar6 & (uint)dPdv[1] |
                         (uint)(((fVar32 * fVar45 + fVar2 * fVar29 + fVar3 * fVar20 + fVar4 * fVar35
                                 ) * fVar15 * 0.16666667 +
                                 (fVar30 * fVar45 +
                                 fVar1 * fVar29 + fVar56 * fVar20 + fVar57 * fVar35) *
                                 (fVar11 * fVar39 * 6.0 + fVar44 * fVar39 * 12.0 +
                                 fVar15 * 4.0 + fVar21) * 0.16666667 +
                                 (fVar28 * fVar45 +
                                 fVar53 * fVar29 + fVar54 * fVar20 + fVar55 * fVar35) *
                                 (fVar44 * fVar39 * 6.0 + fVar11 * fVar39 * 12.0 +
                                 fVar21 * 4.0 + fVar15) * 0.16666667 +
                                (fVar26 * fVar45 +
                                fVar50 * fVar29 + fVar51 * fVar20 + fVar52 * fVar35) *
                                fVar21 * 0.16666667) * dscale) & uVar6);
        dPdv[2] = (float)(~uVar7 & (uint)dPdv[2] |
                         (uint)(((fVar32 * fVar47 + fVar2 * fVar31 + fVar3 * fVar22 + fVar4 * fVar36
                                 ) * fVar16 * 0.16666667 +
                                 (fVar30 * fVar47 +
                                 fVar1 * fVar31 + fVar56 * fVar22 + fVar57 * fVar36) *
                                 (fVar12 * fVar40 * 6.0 + fVar46 * fVar40 * 12.0 +
                                 fVar16 * 4.0 + fVar23) * 0.16666667 +
                                 (fVar28 * fVar47 +
                                 fVar53 * fVar31 + fVar54 * fVar22 + fVar55 * fVar36) *
                                 (fVar46 * fVar40 * 6.0 + fVar12 * fVar40 * 12.0 +
                                 fVar23 * 4.0 + fVar16) * 0.16666667 +
                                (fVar26 * fVar47 +
                                fVar50 * fVar31 + fVar51 * fVar22 + fVar52 * fVar36) *
                                fVar23 * 0.16666667) * dscale) & uVar7);
        dPdv[3] = (float)(~uVar8 & (uint)dPdv[3] |
                         (uint)(((fVar32 * fVar49 + fVar2 * fVar33 + fVar3 * fVar24 + fVar4 * fVar37
                                 ) * fVar17 * 0.16666667 +
                                 (fVar30 * fVar49 +
                                 fVar1 * fVar33 + fVar56 * fVar24 + fVar57 * fVar37) *
                                 (fVar13 * fVar41 * 6.0 + fVar48 * fVar41 * 12.0 +
                                 fVar17 * 4.0 + fVar25) * 0.16666667 +
                                 (fVar28 * fVar49 +
                                 fVar53 * fVar33 + fVar54 * fVar24 + fVar55 * fVar37) *
                                 (fVar48 * fVar41 * 6.0 + fVar13 * fVar41 * 12.0 +
                                 fVar25 * 4.0 + fVar17) * 0.16666667 +
                                (fVar26 * fVar49 +
                                fVar50 * fVar33 + fVar51 * fVar24 + fVar52 * fVar37) *
                                fVar25 * 0.16666667) * dscale) & uVar8);
        sVar9 = sVar9 + 1;
        dPdv = dPdv + dstride;
      } while (N != sVar9);
    }
  }
  if (ddPdudu != (float *)0x0) {
    fVar42 = (uu->field_0).v[0];
    fVar44 = (uu->field_0).v[1];
    fVar46 = (uu->field_0).v[2];
    fVar48 = (uu->field_0).v[3];
    fVar10 = 1.0 - fVar42;
    fVar11 = 1.0 - fVar44;
    fVar12 = 1.0 - fVar46;
    fVar13 = 1.0 - fVar48;
    fVar18 = (vv->field_0).v[0];
    fVar20 = (vv->field_0).v[1];
    fVar22 = (vv->field_0).v[2];
    fVar24 = (vv->field_0).v[3];
    local_98 = 1.0 - fVar18;
    fStack_94 = 1.0 - fVar20;
    fStack_90 = 1.0 - fVar22;
    fStack_8c = 1.0 - fVar24;
    if (N != 0) {
      fVar26 = local_98 * local_98 * local_98;
      fVar30 = fStack_94 * fStack_94 * fStack_94;
      fVar34 = fStack_90 * fStack_90 * fStack_90;
      fVar36 = fStack_8c * fStack_8c * fStack_8c;
      fVar38 = fVar18 * fVar18 * fVar18;
      fVar39 = fVar20 * fVar20 * fVar20;
      fVar40 = fVar22 * fVar22 * fVar22;
      fVar41 = fVar24 * fVar24 * fVar24;
      fVar14 = local_98 * fVar18 * local_98;
      fVar15 = fStack_94 * fVar20 * fStack_94;
      fVar16 = fStack_90 * fVar22 * fStack_90;
      fVar17 = fStack_8c * fVar24 * fStack_8c;
      fVar18 = fVar18 * local_98 * fVar18;
      fVar20 = fVar20 * fStack_94 * fVar20;
      fVar22 = fVar22 * fStack_90 * fVar22;
      fVar24 = fVar24 * fStack_8c * fVar24;
      fVar28 = fVar26 * 0.16666667;
      fVar32 = fVar30 * 0.16666667;
      fVar35 = fVar34 * 0.16666667;
      fVar37 = fVar36 * 0.16666667;
      fVar19 = (fVar18 * 6.0 + fVar14 * 12.0 + fVar26 * 4.0 + fVar38) * 0.16666667;
      fVar21 = (fVar20 * 6.0 + fVar15 * 12.0 + fVar30 * 4.0 + fVar39) * 0.16666667;
      fVar23 = (fVar22 * 6.0 + fVar16 * 12.0 + fVar34 * 4.0 + fVar40) * 0.16666667;
      fVar25 = (fVar24 * 6.0 + fVar17 * 12.0 + fVar36 * 4.0 + fVar41) * 0.16666667;
      fVar18 = (fVar14 * 6.0 + fVar18 * 12.0 + fVar38 * 4.0 + fVar26) * 0.16666667;
      fVar20 = (fVar15 * 6.0 + fVar20 * 12.0 + fVar39 * 4.0 + fVar30) * 0.16666667;
      fVar22 = (fVar16 * 6.0 + fVar22 * 12.0 + fVar40 * 4.0 + fVar34) * 0.16666667;
      fVar24 = (fVar17 * 6.0 + fVar24 * 12.0 + fVar41 * 4.0 + fVar36) * 0.16666667;
      fVar38 = fVar38 * 0.16666667;
      fVar39 = fVar39 * 0.16666667;
      fVar40 = fVar40 * 0.16666667;
      fVar41 = fVar41 * 0.16666667;
      fVar14 = dscale * dscale;
      sVar9 = 0;
      do {
        fVar15 = *(float *)(this + sVar9 * 4);
        fVar16 = *(float *)(this + sVar9 * 4 + 0x10);
        fVar17 = *(float *)(this + sVar9 * 4 + 0x20);
        fVar26 = *(float *)(this + sVar9 * 4 + 0x30);
        fVar30 = *(float *)(this + sVar9 * 4 + 0x40);
        fVar34 = *(float *)(this + sVar9 * 4 + 0x80);
        fVar36 = *(float *)(this + sVar9 * 4 + 0xc0);
        fVar43 = *(float *)(this + sVar9 * 4 + 0x50);
        fVar45 = *(float *)(this + sVar9 * 4 + 0x90);
        fVar47 = *(float *)(this + sVar9 * 4 + 0xd0);
        fVar49 = *(float *)(this + sVar9 * 4 + 0xa0);
        fVar50 = *(float *)(this + sVar9 * 4 + 0xe0);
        fVar51 = *(float *)(this + sVar9 * 4 + 0x60);
        fVar52 = *(float *)(this + sVar9 * 4 + 0x70);
        fVar53 = *(float *)(this + sVar9 * 4 + 0xb0);
        fVar27 = *(float *)(this + sVar9 * 4 + 0xf0);
        uVar6 = (valid->field_0).i[1];
        uVar7 = (valid->field_0).i[2];
        uVar8 = (valid->field_0).i[3];
        *ddPdudu = (float)(~(valid->field_0).i[0] & (uint)*ddPdudu |
                          (uint)(((fVar15 * fVar28 +
                                  fVar30 * fVar19 + fVar34 * fVar18 + fVar36 * fVar38) * fVar10 +
                                 (fVar26 * fVar28 +
                                 fVar52 * fVar19 + fVar53 * fVar18 + fVar27 * fVar38) * fVar42 +
                                 (fVar17 * fVar28 +
                                 fVar51 * fVar19 + fVar49 * fVar18 + fVar50 * fVar38) *
                                 (fVar10 - (fVar42 + fVar42)) +
                                 (fVar16 * fVar28 +
                                 fVar43 * fVar19 + fVar45 * fVar18 + fVar47 * fVar38) *
                                 (fVar42 - (fVar10 + fVar10))) * fVar14) & (valid->field_0).i[0]);
        ddPdudu[1] = (float)(~uVar6 & (uint)ddPdudu[1] |
                            (uint)(((fVar15 * fVar32 +
                                    fVar30 * fVar21 + fVar34 * fVar20 + fVar36 * fVar39) * fVar11 +
                                   (fVar26 * fVar32 +
                                   fVar52 * fVar21 + fVar53 * fVar20 + fVar27 * fVar39) * fVar44 +
                                   (fVar17 * fVar32 +
                                   fVar51 * fVar21 + fVar49 * fVar20 + fVar50 * fVar39) *
                                   (fVar11 - (fVar44 + fVar44)) +
                                   (fVar16 * fVar32 +
                                   fVar43 * fVar21 + fVar45 * fVar20 + fVar47 * fVar39) *
                                   (fVar44 - (fVar11 + fVar11))) * fVar14) & uVar6);
        ddPdudu[2] = (float)(~uVar7 & (uint)ddPdudu[2] |
                            (uint)(((fVar15 * fVar35 +
                                    fVar30 * fVar23 + fVar34 * fVar22 + fVar36 * fVar40) * fVar12 +
                                   (fVar26 * fVar35 +
                                   fVar52 * fVar23 + fVar53 * fVar22 + fVar27 * fVar40) * fVar46 +
                                   (fVar17 * fVar35 +
                                   fVar51 * fVar23 + fVar49 * fVar22 + fVar50 * fVar40) *
                                   (fVar12 - (fVar46 + fVar46)) +
                                   (fVar16 * fVar35 +
                                   fVar43 * fVar23 + fVar45 * fVar22 + fVar47 * fVar40) *
                                   (fVar46 - (fVar12 + fVar12))) * fVar14) & uVar7);
        ddPdudu[3] = (float)(~uVar8 & (uint)ddPdudu[3] |
                            (uint)(((fVar15 * fVar37 +
                                    fVar30 * fVar25 + fVar34 * fVar24 + fVar36 * fVar41) * fVar13 +
                                   (fVar26 * fVar37 +
                                   fVar52 * fVar25 + fVar53 * fVar24 + fVar27 * fVar41) * fVar48 +
                                   (fVar17 * fVar37 +
                                   fVar51 * fVar25 + fVar49 * fVar24 + fVar50 * fVar41) *
                                   (fVar13 - (fVar48 + fVar48)) +
                                   (fVar16 * fVar37 +
                                   fVar43 * fVar25 + fVar45 * fVar24 + fVar47 * fVar41) *
                                   (fVar48 - (fVar13 + fVar13))) * fVar14) & uVar8);
        sVar9 = sVar9 + 1;
        ddPdudu = ddPdudu + dstride;
      } while (N != sVar9);
      fVar42 = (uu->field_0).v[0];
      fVar44 = (uu->field_0).v[1];
      fVar46 = (uu->field_0).v[2];
      fVar48 = (uu->field_0).v[3];
      fVar18 = (vv->field_0).v[0];
      fVar20 = (vv->field_0).v[1];
      fVar22 = (vv->field_0).v[2];
      fVar24 = (vv->field_0).v[3];
      fVar10 = 1.0 - fVar42;
      fVar11 = 1.0 - fVar44;
      fVar12 = 1.0 - fVar46;
      fVar13 = 1.0 - fVar48;
      local_98 = 1.0 - fVar18;
      fStack_94 = 1.0 - fVar20;
      fStack_90 = 1.0 - fVar22;
      fStack_8c = 1.0 - fVar24;
    }
    fVar19 = fVar10 * fVar10;
    fVar21 = fVar11 * fVar11;
    fVar23 = fVar12 * fVar12;
    fVar25 = fVar13 * fVar13;
    fVar26 = fVar42 * fVar42;
    fVar28 = fVar44 * fVar44;
    fVar30 = fVar46 * fVar46;
    fVar32 = fVar48 * fVar48;
    fVar14 = fVar42 * fVar10;
    fVar15 = fVar44 * fVar11;
    fVar16 = fVar46 * fVar12;
    fVar17 = fVar48 * fVar13;
    if (N != 0) {
      fVar19 = fVar19 * fVar10;
      fVar21 = fVar21 * fVar11;
      fVar23 = fVar23 * fVar12;
      fVar25 = fVar25 * fVar13;
      fVar26 = fVar26 * fVar42;
      fVar28 = fVar28 * fVar44;
      fVar30 = fVar30 * fVar46;
      fVar32 = fVar32 * fVar48;
      fVar34 = fVar18 - (local_98 + local_98);
      fVar35 = fVar20 - (fStack_94 + fStack_94);
      fVar36 = fVar22 - (fStack_90 + fStack_90);
      fVar37 = fVar24 - (fStack_8c + fStack_8c);
      fVar38 = local_98 - (fVar18 + fVar18);
      fVar39 = fStack_94 - (fVar20 + fVar20);
      fVar40 = fStack_90 - (fVar22 + fVar22);
      fVar41 = fStack_8c - (fVar24 + fVar24);
      fVar43 = dscale * dscale;
      sVar9 = 0;
      do {
        fVar45 = *(float *)(this + sVar9 * 4);
        fVar47 = *(float *)(this + sVar9 * 4 + 0x10);
        fVar49 = *(float *)(this + sVar9 * 4 + 0x20);
        fVar50 = *(float *)(this + sVar9 * 4 + 0x30);
        fVar51 = *(float *)(this + sVar9 * 4 + 0x40);
        fVar52 = *(float *)(this + sVar9 * 4 + 0x80);
        fVar53 = *(float *)(this + sVar9 * 4 + 0xc0);
        fVar27 = *(float *)(this + sVar9 * 4 + 0x50);
        fVar29 = *(float *)(this + sVar9 * 4 + 0x90);
        fVar31 = *(float *)(this + sVar9 * 4 + 0xd0);
        fVar33 = *(float *)(this + sVar9 * 4 + 0xa0);
        fVar54 = *(float *)(this + sVar9 * 4 + 0xe0);
        fVar55 = *(float *)(this + sVar9 * 4 + 0x60);
        fVar56 = *(float *)(this + sVar9 * 4 + 0x70);
        fVar57 = *(float *)(this + sVar9 * 4 + 0xb0);
        fVar1 = *(float *)(this + sVar9 * 4 + 0xf0);
        uVar6 = (valid->field_0).i[1];
        uVar7 = (valid->field_0).i[2];
        uVar8 = (valid->field_0).i[3];
        *ddPdvdv = (float)(~(valid->field_0).i[0] & (uint)*ddPdvdv |
                          (uint)(((fVar50 * local_98 +
                                  fVar56 * fVar34 + fVar57 * fVar38 + fVar1 * fVar18) *
                                  fVar26 * 0.16666667 +
                                  (fVar49 * local_98 +
                                  fVar55 * fVar34 + fVar33 * fVar38 + fVar54 * fVar18) *
                                  (fVar10 * fVar14 * 6.0 + fVar42 * fVar14 * 12.0 +
                                  fVar26 * 4.0 + fVar19) * 0.16666667 +
                                  (fVar47 * local_98 +
                                  fVar27 * fVar34 + fVar29 * fVar38 + fVar31 * fVar18) *
                                  (fVar42 * fVar14 * 6.0 + fVar10 * fVar14 * 12.0 +
                                  fVar19 * 4.0 + fVar26) * 0.16666667 +
                                 (fVar45 * local_98 +
                                 fVar51 * fVar34 + fVar52 * fVar38 + fVar53 * fVar18) *
                                 fVar19 * 0.16666667) * fVar43) & (valid->field_0).i[0]);
        ddPdvdv[1] = (float)(~uVar6 & (uint)ddPdvdv[1] |
                            (uint)(((fVar50 * fStack_94 +
                                    fVar56 * fVar35 + fVar57 * fVar39 + fVar1 * fVar20) *
                                    fVar28 * 0.16666667 +
                                    (fVar49 * fStack_94 +
                                    fVar55 * fVar35 + fVar33 * fVar39 + fVar54 * fVar20) *
                                    (fVar11 * fVar15 * 6.0 + fVar44 * fVar15 * 12.0 +
                                    fVar28 * 4.0 + fVar21) * 0.16666667 +
                                    (fVar47 * fStack_94 +
                                    fVar27 * fVar35 + fVar29 * fVar39 + fVar31 * fVar20) *
                                    (fVar44 * fVar15 * 6.0 + fVar11 * fVar15 * 12.0 +
                                    fVar21 * 4.0 + fVar28) * 0.16666667 +
                                   (fVar45 * fStack_94 +
                                   fVar51 * fVar35 + fVar52 * fVar39 + fVar53 * fVar20) *
                                   fVar21 * 0.16666667) * fVar43) & uVar6);
        ddPdvdv[2] = (float)(~uVar7 & (uint)ddPdvdv[2] |
                            (uint)(((fVar50 * fStack_90 +
                                    fVar56 * fVar36 + fVar57 * fVar40 + fVar1 * fVar22) *
                                    fVar30 * 0.16666667 +
                                    (fVar49 * fStack_90 +
                                    fVar55 * fVar36 + fVar33 * fVar40 + fVar54 * fVar22) *
                                    (fVar12 * fVar16 * 6.0 + fVar46 * fVar16 * 12.0 +
                                    fVar30 * 4.0 + fVar23) * 0.16666667 +
                                    (fVar47 * fStack_90 +
                                    fVar27 * fVar36 + fVar29 * fVar40 + fVar31 * fVar22) *
                                    (fVar46 * fVar16 * 6.0 + fVar12 * fVar16 * 12.0 +
                                    fVar23 * 4.0 + fVar30) * 0.16666667 +
                                   (fVar45 * fStack_90 +
                                   fVar51 * fVar36 + fVar52 * fVar40 + fVar53 * fVar22) *
                                   fVar23 * 0.16666667) * fVar43) & uVar7);
        ddPdvdv[3] = (float)(~uVar8 & (uint)ddPdvdv[3] |
                            (uint)(((fVar50 * fStack_8c +
                                    fVar56 * fVar37 + fVar57 * fVar41 + fVar1 * fVar24) *
                                    fVar32 * 0.16666667 +
                                    (fVar49 * fStack_8c +
                                    fVar55 * fVar37 + fVar33 * fVar41 + fVar54 * fVar24) *
                                    (fVar13 * fVar17 * 6.0 + fVar48 * fVar17 * 12.0 +
                                    fVar32 * 4.0 + fVar25) * 0.16666667 +
                                    (fVar47 * fStack_8c +
                                    fVar27 * fVar37 + fVar29 * fVar41 + fVar31 * fVar24) *
                                    (fVar48 * fVar17 * 6.0 + fVar13 * fVar17 * 12.0 +
                                    fVar25 * 4.0 + fVar32) * 0.16666667 +
                                   (fVar45 * fStack_8c +
                                   fVar51 * fVar37 + fVar52 * fVar41 + fVar53 * fVar24) *
                                   fVar25 * 0.16666667) * fVar43) & uVar8);
        sVar9 = sVar9 + 1;
        ddPdvdv = ddPdvdv + dstride;
      } while (N != sVar9);
      fVar42 = (uu->field_0).v[0];
      fVar44 = (uu->field_0).v[1];
      fVar46 = (uu->field_0).v[2];
      fVar48 = (uu->field_0).v[3];
      fVar18 = (vv->field_0).v[0];
      fVar20 = (vv->field_0).v[1];
      fVar22 = (vv->field_0).v[2];
      fVar24 = (vv->field_0).v[3];
      fVar10 = 1.0 - fVar42;
      fVar11 = 1.0 - fVar44;
      fVar12 = 1.0 - fVar46;
      fVar13 = 1.0 - fVar48;
      fVar14 = fVar42 * fVar10;
      fVar15 = fVar44 * fVar11;
      fVar16 = fVar46 * fVar12;
      fVar17 = fVar48 * fVar13;
      fVar19 = fVar10 * fVar10;
      fVar21 = fVar11 * fVar11;
      fVar23 = fVar12 * fVar12;
      fVar25 = fVar13 * fVar13;
      fVar26 = fVar42 * fVar42;
      fVar28 = fVar44 * fVar44;
      fVar30 = fVar46 * fVar46;
      fVar32 = fVar48 * fVar48;
      local_98 = 1.0 - fVar18;
      fStack_94 = 1.0 - fVar20;
      fStack_90 = 1.0 - fVar22;
      fStack_8c = 1.0 - fVar24;
    }
    if (N != 0) {
      fVar34 = fVar18 * local_98 * 4.0;
      fVar35 = fVar20 * fStack_94 * 4.0;
      fVar36 = fVar22 * fStack_90 * 4.0;
      fVar37 = fVar24 * fStack_8c * 4.0;
      fVar43 = -local_98 * local_98 * 0.5;
      fVar45 = -fStack_94 * fStack_94 * 0.5;
      fVar47 = -fStack_90 * fStack_90 * 0.5;
      fVar49 = -fStack_8c * fStack_8c * 0.5;
      fVar38 = (-fVar18 * fVar18 - fVar34) * 0.5;
      fVar39 = (-fVar20 * fVar20 - fVar35) * 0.5;
      fVar40 = (-fVar22 * fVar22 - fVar36) * 0.5;
      fVar41 = (-fVar24 * fVar24 - fVar37) * 0.5;
      fVar34 = (local_98 * local_98 + fVar34) * 0.5;
      fVar35 = (fStack_94 * fStack_94 + fVar35) * 0.5;
      fVar36 = (fStack_90 * fStack_90 + fVar36) * 0.5;
      fVar37 = (fStack_8c * fStack_8c + fVar37) * 0.5;
      fVar18 = fVar18 * fVar18 * 0.5;
      fVar20 = fVar20 * fVar20 * 0.5;
      fVar22 = fVar22 * fVar22 * 0.5;
      fVar24 = fVar24 * fVar24 * 0.5;
      fVar50 = dscale * dscale;
      sVar9 = 0;
      do {
        fVar51 = *(float *)(this + sVar9 * 4);
        fVar52 = *(float *)(this + sVar9 * 4 + 0x10);
        fVar53 = *(float *)(this + sVar9 * 4 + 0x20);
        fVar27 = *(float *)(this + sVar9 * 4 + 0x30);
        fVar29 = *(float *)(this + sVar9 * 4 + 0x40);
        fVar31 = *(float *)(this + sVar9 * 4 + 0x80);
        fVar33 = *(float *)(this + sVar9 * 4 + 0xc0);
        fVar54 = *(float *)(this + sVar9 * 4 + 0x50);
        fVar55 = *(float *)(this + sVar9 * 4 + 0x90);
        fVar56 = *(float *)(this + sVar9 * 4 + 0xd0);
        fVar57 = *(float *)(this + sVar9 * 4 + 0xa0);
        fVar1 = *(float *)(this + sVar9 * 4 + 0xe0);
        fVar2 = *(float *)(this + sVar9 * 4 + 0x60);
        fVar3 = *(float *)(this + sVar9 * 4 + 0x70);
        fVar4 = *(float *)(this + sVar9 * 4 + 0xb0);
        fVar5 = *(float *)(this + sVar9 * 4 + 0xf0);
        uVar6 = (valid->field_0).i[1];
        uVar7 = (valid->field_0).i[2];
        uVar8 = (valid->field_0).i[3];
        *ddPdudv = (float)(~(valid->field_0).i[0] & (uint)*ddPdudv |
                          (uint)(((fVar27 * fVar43 +
                                  fVar3 * fVar38 + fVar4 * fVar34 + fVar5 * fVar18) * fVar26 * 0.5 +
                                  (fVar53 * fVar43 +
                                  fVar2 * fVar38 + fVar57 * fVar34 + fVar1 * fVar18) *
                                  (fVar19 + fVar14 * 4.0) * 0.5 +
                                  (fVar52 * fVar43 +
                                  fVar54 * fVar38 + fVar55 * fVar34 + fVar56 * fVar18) *
                                  (-fVar42 * fVar42 - fVar14 * 4.0) * 0.5 +
                                 (fVar51 * fVar43 +
                                 fVar29 * fVar38 + fVar31 * fVar34 + fVar33 * fVar18) *
                                 -fVar10 * fVar10 * 0.5) * fVar50) & (valid->field_0).i[0]);
        ddPdudv[1] = (float)(~uVar6 & (uint)ddPdudv[1] |
                            (uint)(((fVar27 * fVar45 +
                                    fVar3 * fVar39 + fVar4 * fVar35 + fVar5 * fVar20) * fVar28 * 0.5
                                    + (fVar53 * fVar45 +
                                      fVar2 * fVar39 + fVar57 * fVar35 + fVar1 * fVar20) *
                                      (fVar21 + fVar15 * 4.0) * 0.5 +
                                    (fVar52 * fVar45 +
                                    fVar54 * fVar39 + fVar55 * fVar35 + fVar56 * fVar20) *
                                    (-fVar44 * fVar44 - fVar15 * 4.0) * 0.5 +
                                   (fVar51 * fVar45 +
                                   fVar29 * fVar39 + fVar31 * fVar35 + fVar33 * fVar20) *
                                   -fVar11 * fVar11 * 0.5) * fVar50) & uVar6);
        ddPdudv[2] = (float)(~uVar7 & (uint)ddPdudv[2] |
                            (uint)(((fVar27 * fVar47 +
                                    fVar3 * fVar40 + fVar4 * fVar36 + fVar5 * fVar22) * fVar30 * 0.5
                                    + (fVar53 * fVar47 +
                                      fVar2 * fVar40 + fVar57 * fVar36 + fVar1 * fVar22) *
                                      (fVar23 + fVar16 * 4.0) * 0.5 +
                                    (fVar52 * fVar47 +
                                    fVar54 * fVar40 + fVar55 * fVar36 + fVar56 * fVar22) *
                                    (-fVar46 * fVar46 - fVar16 * 4.0) * 0.5 +
                                   (fVar51 * fVar47 +
                                   fVar29 * fVar40 + fVar31 * fVar36 + fVar33 * fVar22) *
                                   -fVar12 * fVar12 * 0.5) * fVar50) & uVar7);
        ddPdudv[3] = (float)(~uVar8 & (uint)ddPdudv[3] |
                            (uint)(((fVar27 * fVar49 +
                                    fVar3 * fVar41 + fVar4 * fVar37 + fVar5 * fVar24) * fVar32 * 0.5
                                    + (fVar53 * fVar49 +
                                      fVar2 * fVar41 + fVar57 * fVar37 + fVar1 * fVar24) *
                                      (fVar25 + fVar17 * 4.0) * 0.5 +
                                    (fVar52 * fVar49 +
                                    fVar54 * fVar41 + fVar55 * fVar37 + fVar56 * fVar24) *
                                    (-fVar48 * fVar48 - fVar17 * 4.0) * 0.5 +
                                   (fVar51 * fVar49 +
                                   fVar29 * fVar41 + fVar31 * fVar37 + fVar33 * fVar24) *
                                   -fVar13 * fVar13 * 0.5) * fVar50) & uVar8);
        sVar9 = sVar9 + 1;
        ddPdudv = ddPdudv + dstride;
      } while (N != sVar9);
    }
  }
  return;
}

Assistant:

void eval(const vbool& valid, const vfloat& uu, const vfloat& vv, 
                float* P, float* dPdu, float* dPdv, float* ddPdudu, float* ddPdvdv, float* ddPdudv, 
                const float dscale, const size_t dstride, const size_t N) const
      {
        if (P) {
          const Vec4<vfloat> u_n = BSplineBasis::eval(uu); 
          const Vec4<vfloat> v_n = BSplineBasis::eval(vv); 
          for (size_t i=0; i<N; i++) vfloat::store(valid,P+i*dstride,eval(i,uu,vv,u_n,v_n));
        }
        if (dPdu) 
        {
          {
            assert(dPdu);
            const Vec4<vfloat> u_n = BSplineBasis::derivative(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::eval(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,dPdu+i*dstride,eval(i,uu,vv,u_n,v_n)*dscale);
          }
          {
            assert(dPdv);
            const Vec4<vfloat> u_n = BSplineBasis::eval(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::derivative(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,dPdv+i*dstride,eval(i,uu,vv,u_n,v_n)*dscale);
          }
        }
        if (ddPdudu) 
        {
          {
            assert(ddPdudu);
            const Vec4<vfloat> u_n = BSplineBasis::derivative2(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::eval(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,ddPdudu+i*dstride,eval(i,uu,vv,u_n,v_n)*sqr(dscale));
          }
          {
            assert(ddPdvdv);
            const Vec4<vfloat> u_n = BSplineBasis::eval(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::derivative2(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,ddPdvdv+i*dstride,eval(i,uu,vv,u_n,v_n)*sqr(dscale));
          }
          {
            assert(ddPdudv);
            const Vec4<vfloat> u_n = BSplineBasis::derivative(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::derivative(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,ddPdudv+i*dstride,eval(i,uu,vv,u_n,v_n)*sqr(dscale));
          }
        }
      }